

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O0

CBString * getAbsPath(CBString *__return_storage_ptr__,CBString *path)

{
  char *__name;
  CBString local_40;
  undefined1 local_21;
  char *local_20;
  char *abs;
  CBString *path_local;
  CBString *new_path;
  
  abs = (char *)path;
  path_local = __return_storage_ptr__;
  __name = Bstrlib::CBString::toLocal8Bit(path);
  local_20 = realpath(__name,(char *)0x0);
  local_21 = 0;
  Bstrlib::CBString::CBString(__return_storage_ptr__);
  if (local_20 == (char *)0x0) {
    Bstrlib::CBString::operator=(__return_storage_ptr__,(CBString *)abs);
  }
  else {
    Bstrlib::CBString::CBString(&local_40,local_20);
    Bstrlib::CBString::operator=(__return_storage_ptr__,&local_40);
    Bstrlib::CBString::~CBString(&local_40);
  }
  free(local_20);
  return __return_storage_ptr__;
}

Assistant:

UString getAbsPath(const UString & path) {
    char * abs = realpath(path.toLocal8Bit(), nullptr);
    // Last is a non-standard extension for non-existent files
    UString new_path;
    if (abs)
        new_path = UString(abs);
    else
        new_path = path;
    free(abs);
    return new_path;
}